

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<kj::Promise<void>_>::truncate
          (ArrayBuilder<kj::Promise<void>_> *this,char *__file,__off_t __length)

{
  Promise<void> *pPVar1;
  PromiseNode *pPVar2;
  Disposer *pDVar3;
  Promise<void> *pPVar4;
  Promise<void> *pPVar5;
  
  pPVar1 = this->ptr;
  pPVar5 = this->pos;
  while (pPVar4 = pPVar5, pPVar1 + (long)__file < pPVar4) {
    this->pos = pPVar4 + -1;
    pPVar2 = pPVar4[-1].super_PromiseBase.node.ptr;
    pPVar5 = pPVar4 + -1;
    if (pPVar2 != (PromiseNode *)0x0) {
      pPVar4[-1].super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      pDVar3 = pPVar4[-1].super_PromiseBase.node.disposer;
      (**pDVar3->_vptr_Disposer)
                (pDVar3,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
      pPVar5 = this->pos;
    }
  }
  return (int)pPVar4;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (__has_trivial_destructor(T)) {
      pos = target;
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }